

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadDsd.c
# Opt level: O3

int Io_ReadDsdStrSplit(char *pCur,char **pParts,int *pTypeXor)

{
  byte bVar1;
  char *pCur_00;
  char cVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  char *__s;
  
  if (*pCur == '\0') {
    __assert_fail("*pCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioReadDsd.c"
                  ,0x4c,"int Io_ReadDsdStrSplit(char *, char **, int *)");
  }
  lVar6 = 0;
  __s = "Wrong separating symbol.";
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  do {
    pParts[lVar6] = pCur;
    lVar6 = lVar6 + 1;
    pCur_00 = pCur + (*pCur == '!');
    cVar2 = pCur[*pCur == '!'];
    if (0x19 < (byte)(cVar2 + 0x9fU)) {
      if ((byte)(cVar2 - 0x30U) < 10 || (byte)(cVar2 + 0xbfU) < 6) {
        do {
          cVar2 = pCur_00[1];
          pCur_00 = pCur_00 + 1;
        } while ((byte)(cVar2 + 0xbfU) < 6 || (byte)(cVar2 - 0x30U) < 10);
      }
      if (cVar2 != '(') {
        __s = "Cannot find the opening parenthesis.";
        goto LAB_00333914;
      }
      pCur_00 = Io_ReadDsdFindEnd(pCur_00);
      if (pCur_00 == (char *)0x0) {
        __s = "Cannot find the closing parenthesis.";
        goto LAB_00333914;
      }
    }
    bVar1 = pCur_00[1];
    if (2 < bVar1 - 0x2a) {
      if (bVar1 != 0) {
LAB_00333914:
        puts(__s);
      }
      if (uVar5 + uVar4 + uVar3 < 2) {
        *pTypeXor = uVar4;
      }
      else {
        puts("Different types of separating symbol ennPartsed.");
        lVar6 = 0;
      }
      return (int)lVar6;
    }
    uVar5 = uVar5 | bVar1 == 0x2a;
    uVar4 = uVar4 | bVar1 == 0x2b;
    uVar3 = uVar3 | bVar1 == 0x2c;
    pCur_00[1] = '\0';
    pCur = pCur_00 + 2;
  } while( true );
}

Assistant:

int Io_ReadDsdStrSplit( char * pCur, char * pParts[], int * pTypeXor )
{
    int fAnd = 0, fXor = 0, fPri = 0, nParts = 0;
    assert( *pCur );
    // process the parts
    while ( 1 )
    {
        // save the current part
        pParts[nParts++] = pCur;
        // skip the complement
        if ( *pCur == '!' )
            pCur++;
        // skip var
        if ( *pCur >= 'a' && *pCur <= 'z' )
            pCur++;
        else
        {
            // skip hex truth table
            while ( (*pCur >= '0' && *pCur <= '9') || (*pCur >= 'A' && *pCur <= 'F') )
                pCur++;
            // process parentheses
            if ( *pCur != '(' )
            {
                printf( "Cannot find the opening parenthesis.\n" );
                break;
            }
            // find the corresponding closing parenthesis
            pCur = Io_ReadDsdFindEnd( pCur );
            if ( pCur == NULL )
            {
                printf( "Cannot find the closing parenthesis.\n" );
                break;
            }
            pCur++;
        }
        // check the end
        if ( *pCur == 0 )
            break;
        // check symbol
        if ( *pCur != '*' && *pCur != '+' && *pCur != ',' )
        {
            printf( "Wrong separating symbol.\n" );
            break;
        }
        // remember the symbol
        fAnd |= (*pCur == '*');
        fXor |= (*pCur == '+');
        fPri |= (*pCur == ',');
        *pCur++ = 0;
    }
    // check separating symbols
    if ( fAnd + fXor + fPri > 1 )
    {
        printf( "Different types of separating symbol ennPartsed.\n" );
        return 0;
    }
    *pTypeXor = fXor;
    return nParts;
}